

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xb3,"void mean_double_suite::test_exponential_increase()",local_38,&local_40);
  builtin_strncpy(local_38,"333333\x17@",8);
  local_40 = 5.8;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb5,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = -0x23;
  local_38[1] = -0x42;
  local_38[2] = -0x4e;
  local_38[3] = 'z';
  local_38[4] = -0x69;
  local_38[5] = -0x44;
  local_38[6] = 'D';
  local_38[7] = '@';
  local_40 = 41.473;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.473","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb7,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x48;
  local_38[1] = '\x02';
  local_38[2] = 'R';
  local_38[3] = '\x7f';
  local_38[4] = '+';
  local_38[5] = -0x50;
  local_38[6] = 't';
  local_38[7] = '@';
  local_40 = 331.01;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xb9,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = -0x1e;
  local_38[1] = -0x65;
  local_38[2] = '1';
  local_38[3] = -0x1d;
  local_38[4] = -0x5d;
  local_38[5] = -8;
  local_38[6] = -0x5b;
  local_38[7] = '@';
  local_40 = 2812.32;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbb,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = 'm';
  local_38[1] = -0x44;
  local_38[2] = -0x1f;
  local_38[3] = -0x1b;
  local_38[4] = '\t';
  local_38[5] = 'E';
  local_38[6] = -0x28;
  local_38[7] = '@';
  local_40 = 24852.2;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbd,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x31;
  local_38[1] = 'Z';
  local_38[2] = -0x6a;
  local_38[3] = -0x54;
  local_38[4] = -0x1c;
  local_38[5] = -0x78;
  local_38[6] = '\v';
  local_38[7] = 'A';
  local_40 = 225565.0;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xbf,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = -0x7a;
  local_38[1] = -0x35;
  local_38[2] = '\x0f';
  local_38[3] = -0x5e;
  local_38[4] = '1';
  local_38[5] = -0x28;
  local_38[6] = '?';
  local_38[7] = 'A';
  local_40 = 2086960.0;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc1,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = -0x35;
  local_38[1] = -0x1f;
  local_38[2] = -0x5d;
  local_38[3] = 'j';
  local_38[4] = '2';
  local_38[5] = -0x52;
  local_38[6] = 'r';
  local_38[7] = 'A';
  local_40 = 19587900.0;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc3,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = 'R';
  local_38[1] = 'G';
  local_38[2] = '|';
  local_38[3] = 'z';
  local_38[4] = -0x1d;
  local_38[5] = '(';
  local_38[6] = -0x5a;
  local_38[7] = 'A';
  local_40 = 185889000.0;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xc5,0x10e385,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.473, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
}